

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_file_identifier(uchar *bp,int from,int to,vdc vdc,archive_write *a,vdd *vdd,
                       archive_string *id,char *label,int leading_under,char_type char_type)

{
  char *s;
  isoent *piVar1;
  ulong __n;
  archive *in_R8;
  isoent *in_R9;
  int r;
  size_t len;
  char *ids;
  isoent *isoent;
  char identifier [256];
  int local_154;
  undefined8 in_stack_fffffffffffffeb0;
  vdc vVar2;
  char *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  int from_00;
  int iVar3;
  uchar *in_stack_fffffffffffffec8;
  archive_write *in_stack_fffffffffffffed0;
  char *in_stack_ffffffffffffffc8;
  
  vVar2 = (vdc)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  iVar3 = (int)in_stack_fffffffffffffec0;
  from_00 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  if (((*(long *)(len + 8) == 0) || ((int)isoent == 0)) || (**(char **)len == '_')) {
    if (*(long *)(len + 8) == 0) {
      if (identifier._0_4_ == 0) {
        local_154 = set_str_a_characters_bp
                              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,from_00,iVar3,
                               in_stack_fffffffffffffeb8,vVar2);
      }
      else {
        local_154 = set_str_d_characters_bp
                              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,from_00,iVar3,
                               in_stack_fffffffffffffeb8,vVar2);
      }
    }
    else {
      s = *(char **)len;
      if ((int)isoent != 0) {
        s = s + 1;
      }
      piVar1 = isoent_find_entry(in_R9,in_stack_ffffffffffffffc8);
      if (piVar1 == (isoent *)0x0) {
        archive_set_error(in_R8,-1,"Not Found %s `%s\'.",ids,s);
        return -0x1e;
      }
      __n = (ulong)(piVar1->ext_off + piVar1->ext_len);
      if (*(int *)((in_R9->rbnode).rb_nodes + 1) == 1) {
        if (0xfe < __n) {
          __n = 0xfe;
        }
      }
      else if (0xff < __n) {
        __n = 0xff;
      }
      memcpy(&stack0xfffffffffffffec8,piVar1->identifier,__n);
      (&stack0xfffffffffffffec8)[__n] = 0;
      if (*(int *)((in_R9->rbnode).rb_nodes + 1) == 1) {
        (&stack0xfffffffffffffec9)[__n] = 0;
      }
      vVar2 = (vdc)(__n >> 0x20);
      iVar3 = (int)((ulong)piVar1 >> 0x20);
      if (identifier._0_4_ == 0) {
        local_154 = set_str_a_characters_bp
                              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,iVar3,(int)piVar1
                               ,s,vVar2);
      }
      else {
        local_154 = set_str_d_characters_bp
                              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,iVar3,(int)piVar1
                               ,s,vVar2);
      }
    }
  }
  else if (identifier._0_4_ == 0) {
    local_154 = set_str_a_characters_bp
                          (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,from_00,iVar3,
                           in_stack_fffffffffffffeb8,vVar2);
  }
  else {
    local_154 = set_str_d_characters_bp
                          (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,from_00,iVar3,
                           in_stack_fffffffffffffeb8,vVar2);
  }
  return local_154;
}

Assistant:

static int
set_file_identifier(unsigned char *bp, int from, int to, enum vdc vdc,
    struct archive_write *a, struct vdd *vdd, struct archive_string *id,
    const char *label, int leading_under, enum char_type char_type)
{
	char identifier[256];
	struct isoent *isoent;
	const char *ids;
	size_t len;
	int r;

	if (id->length > 0 && leading_under && id->s[0] != '_') {
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to, id->s, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to, id->s, vdc);
	} else if (id->length > 0) {
		ids = id->s;
		if (leading_under)
			ids++;
		isoent = isoent_find_entry(vdd->rootent, ids);
		if (isoent == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Not Found %s `%s'.",
			    label, ids);
			return (ARCHIVE_FATAL);
		}
		len = isoent->ext_off + isoent->ext_len;
		if (vdd->vdd_type == VDD_JOLIET) {
			if (len > sizeof(identifier)-2)
				len = sizeof(identifier)-2;
		} else {
			if (len > sizeof(identifier)-1)
				len = sizeof(identifier)-1;
		}
		memcpy(identifier, isoent->identifier, len);
		identifier[len] = '\0';
		if (vdd->vdd_type == VDD_JOLIET) {
			identifier[len+1] = 0;
			vdc = VDC_UCS2_DIRECT;
		}
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to,
			    identifier, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to,
			    identifier, vdc);
	} else {
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to, NULL, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to, NULL, vdc);
	}
	return (r);
}